

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.h
# Opt level: O1

bool BicTest3<Blob<88>,Blob<160>>(pfHash hash,int reps,bool verbose)

{
  ulong uVar1;
  int *piVar2;
  undefined1 auVar3 [32];
  int b;
  uint32_t uVar4;
  uint32_t uVar5;
  void *__s;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  int keybit;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  undefined1 auVar18 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  double dVar23;
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined8 in_XMM7_Qb;
  Blob<160> d;
  Blob<88> key;
  Blob<160> h2;
  Blob<160> h1;
  uint local_104;
  uint local_f4;
  long local_e8;
  undefined1 local_b8 [32];
  undefined7 local_98;
  undefined4 uStack_91;
  undefined1 local_88 [16];
  undefined4 uStack_78;
  undefined1 auStack_74 [12];
  undefined1 local_68 [16];
  undefined4 uStack_58;
  undefined1 auStack_54 [12];
  Rand local_48;
  undefined1 auVar19 [32];
  
  local_48.x = 0x88e23b73;
  local_48.y = 0x11310f6c;
  local_48.z = 0x18847f4;
  local_48.w = 0x1142a2ba;
  uVar16 = 0;
  local_98 = 0;
  uStack_91 = 0;
  uStack_58 = 0;
  local_68 = (undefined1  [16])0x0;
  uStack_78 = 0;
  local_88 = (undefined1  [16])0x0;
  __s = operator_new(0x2260000);
  memset(__s,0,0x2260000);
  local_e8 = (long)__s + 0x10;
  do {
    if ((uVar16 & 7) == 0) {
      putchar(0x2e);
    }
    if (0 < reps) {
      local_f4 = 0;
      do {
        Rand::rand_p(&local_48,&local_98,0xb);
        (*hash)(&local_98,0xb,0,local_68);
        flipbit(&local_98,0xb,(uint32_t)uVar16);
        (*hash)(&local_98,0xb,0,local_88);
        auVar3._16_4_ = uStack_58;
        auVar3._0_16_ = local_68;
        auVar3._20_12_ = auStack_54;
        auVar18 = vmovdqu8_avx512vl(auVar3);
        auVar19._30_2_ = auVar18._30_2_;
        auVar19._0_30_ = ZEXT2030(auVar18._0_20_);
        auVar18._16_4_ = uStack_78;
        auVar18._0_16_ = local_88;
        auVar18._20_12_ = auStack_74;
        auVar18 = vmovdqu8_avx512vl(auVar18);
        auVar20._30_2_ = auVar18._30_2_;
        auVar20._0_30_ = ZEXT2030(auVar18._0_20_);
        local_b8 = vmovdqu8_avx512vl(auVar20 ^ auVar19);
        lVar8 = -0x9f;
        lVar10 = local_e8;
        lVar17 = 0;
        do {
          lVar7 = lVar17 + 1;
          lVar9 = lVar8;
          lVar15 = lVar10;
          do {
            uVar4 = getbit(local_b8,0x14,(uint32_t)lVar17);
            uVar5 = getbit(local_b8,0x14,(int)lVar9 + 0xa0);
            piVar2 = (int *)(lVar15 + (ulong)(uVar5 * 2 | uVar4) * 4);
            *piVar2 = *piVar2 + 1;
            lVar15 = lVar15 + 0x10;
            lVar9 = lVar9 + 1;
          } while (lVar9 != 0);
          lVar10 = lVar10 + 0xa10;
          lVar8 = lVar8 + 1;
          lVar17 = lVar7;
        } while (lVar7 != 0x9f);
        local_f4 = local_f4 + 1;
      } while (local_f4 != reps);
    }
    uVar16 = uVar16 + 1;
    local_e8 = local_e8 + 0x64000;
  } while (uVar16 != 0x58);
  putchar(10);
  lVar10 = (long)__s + 0x10;
  auVar21 = ZEXT864(0) << 0x40;
  uVar6 = 1;
  auVar25 = ZEXT1664(ZEXT816(0x4000000000000000));
  auVar26 = ZEXT1664(ZEXT816(0xbff0000000000000));
  auVar27 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
  uVar13 = 0;
  local_104 = 0;
  local_f4 = 0;
  uVar16 = 0;
  do {
    uVar1 = uVar16 + 1;
    uVar14 = uVar6;
    lVar17 = lVar10;
    do {
      if (verbose) {
        printf("(%3d,%3d) - ",uVar16 & 0xffffffff,uVar14 & 0xffffffff);
        auVar27 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
        auVar26 = ZEXT1664(ZEXT816(0xbff0000000000000));
        auVar25 = ZEXT1664(ZEXT816(0x4000000000000000));
        auVar21 = ZEXT864(auVar21._0_8_);
      }
      uVar12 = 0;
      lVar8 = lVar17;
      do {
        auVar24 = ZEXT864(0) << 0x40;
        lVar7 = 0;
        do {
          auVar22._0_8_ = (double)*(int *)(lVar8 + lVar7 * 4) / (double)(reps / 2);
          auVar22._8_8_ = in_XMM7_Qb;
          auVar22 = vfmadd213sd_fma(auVar22,auVar25._0_16_,auVar26._0_16_);
          auVar22 = vandpd_avx(auVar22,auVar27._0_16_);
          auVar22 = vmaxsd_avx(auVar22,auVar24._0_16_);
          auVar24 = ZEXT1664(auVar22);
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        dVar23 = auVar22._0_8_;
        if (auVar21._0_8_ < dVar23) {
          uVar13 = uVar12 & 0xffffffff;
          auVar21 = ZEXT1664(auVar22);
          local_104 = (uint)uVar16;
          local_f4 = (uint)uVar14;
        }
        if (verbose) {
          iVar11 = 0x2e;
          if ((0.01 <= dVar23) && (iVar11 = 0x6f, 0.05 <= dVar23)) {
            iVar11 = (uint)(0.33 <= dVar23) * 9 + 0x4f;
          }
          putchar(iVar11);
          auVar21 = ZEXT864(auVar21._0_8_);
          auVar25 = ZEXT1664(ZEXT816(0x4000000000000000));
          auVar26 = ZEXT1664(ZEXT816(0xbff0000000000000));
          auVar27 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
        }
        uVar12 = uVar12 + 1;
        lVar8 = lVar8 + 0x64000;
      } while (uVar12 != 0x58);
      if (verbose) {
        putchar(10);
        auVar27 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
        auVar26 = ZEXT1664(ZEXT816(0xbff0000000000000));
        auVar25 = ZEXT1664(ZEXT816(0x4000000000000000));
        auVar21 = ZEXT864(auVar21._0_8_);
      }
      uVar14 = uVar14 + 1;
      lVar17 = lVar17 + 0x10;
    } while (uVar14 != 0xa0);
    if (verbose) {
      iVar11 = 100;
      do {
        putchar(0x2d);
        iVar11 = iVar11 + -1;
      } while (iVar11 != 0);
      putchar(10);
      auVar21 = ZEXT864(auVar21._0_8_);
      auVar25 = ZEXT1664(ZEXT816(0x4000000000000000));
      auVar26 = ZEXT1664(ZEXT816(0xbff0000000000000));
      auVar27 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
    }
    uVar6 = uVar6 + 1;
    lVar10 = lVar10 + 0xa10;
    uVar16 = uVar1;
  } while (uVar1 != 0x9f);
  printf("Max bias %f - (%3d : %3d,%3d)\n",uVar13,(ulong)local_104,(ulong)local_f4);
  operator_delete(__s);
  return auVar21._0_8_ < 0.05;
}

Assistant:

bool BicTest3 ( pfHash hash, const int reps, bool verbose = false )
{
  const int keybytes = sizeof(keytype);
  const int keybits = keybytes * 8;
  const int hashbytes = sizeof(hashtype);
  const int hashbits = hashbytes * 8;
  const int pagesize = hashbits*hashbits*4;

  Rand r(11938);

  double maxBias = 0;
  int maxK = 0;
  int maxA = 0;
  int maxB = 0;

  keytype key;
  hashtype h1,h2;

  std::vector<int> bins(keybits*pagesize,0);

  for(int keybit = 0; keybit < keybits; keybit++)
  {
    if(keybit % (keybits/10) == 0) printf(".");

    int * page = &bins[keybit*pagesize];

    for(int irep = 0; irep < reps; irep++)
    {
      r.rand_p(&key,keybytes);
      hash(&key,keybytes,0,&h1);
      flipbit(key,keybit);
      hash(&key,keybytes,0,&h2);

      hashtype d = h1 ^ h2;

      for(int out1 = 0; out1 < hashbits-1; out1++)
      for(int out2 = out1+1; out2 < hashbits; out2++)
      {
        int * b = &page[(out1*hashbits+out2)*4];

        uint32_t x = getbit(d,out1) | (getbit(d,out2) << 1);

        b[x]++;
      }
    }
  }

  printf("\n");

  for(int out1 = 0; out1 < hashbits-1; out1++)
  {
    for(int out2 = out1+1; out2 < hashbits; out2++)
    {
      if(verbose) printf("(%3d,%3d) - ",out1,out2);

      for(int keybit = 0; keybit < keybits; keybit++)
      {
        int * page = &bins[keybit*pagesize];
        int * bins = &page[(out1*hashbits+out2)*4];

        double bias = 0;

        for(int b = 0; b < 4; b++)
        {
          double b2 = double(bins[b]) / double(reps / 2);
          b2 = fabs(b2 * 2 - 1);

          if(b2 > bias) bias = b2;
        }

        if(bias > maxBias)
        {
          maxBias = bias;
          maxK = keybit;
          maxA = out1;
          maxB = out2;
        }

        if(verbose) 
        {
          if     (bias < 0.01) printf(".");
          else if(bias < 0.05) printf("o");
          else if(bias < 0.33) printf("O");
          else                 printf("X");
        }
      }

      // Finished keybit
      if(verbose) printf("\n");
    }

    if(verbose)
    {
      for(int i = 0; i < keybits+12; i++) printf("-");
      printf("\n");
    }
  }

  printf("Max bias %f - (%3d : %3d,%3d)\n",maxBias,maxK,maxA,maxB);

  // Bit independence is harder to pass than avalanche, so we're a bit more lax here.
  bool result = (maxBias < 0.05);
  return result;
}